

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_decompress_safe_withSmallPrefix
              (char *source,char *dest,int compressedSize,int maxOutputSize,size_t prefixSize)

{
  uint uVar1;
  U16 UVar2;
  int iVar3;
  size_t __n;
  ulong __n_00;
  BYTE *pBVar4;
  BYTE *pBVar5;
  bool bVar6;
  size_t local_238;
  ulong local_230;
  ulong local_220;
  size_t prefixSize_local;
  int maxOutputSize_local;
  int compressedSize_local;
  char *dest_local;
  char *source_local;
  BYTE *oCopyLimit;
  BYTE *copyEnd;
  BYTE *matchEnd;
  size_t mlen;
  BYTE *copyFrom_1;
  BYTE *endOfMatch_1;
  size_t restSize_1;
  size_t copySize_1;
  variable_length_error error_3;
  variable_length_error error_2;
  BYTE *copyFrom;
  BYTE *endOfMatch;
  size_t restSize;
  size_t copySize;
  variable_length_error error_1;
  variable_length_error error;
  size_t length;
  ulong uStack_168;
  uint token;
  size_t offset;
  BYTE *match;
  BYTE *shortoend;
  BYTE *shortiend;
  int checkOffset;
  int safeDecode;
  BYTE *dictEnd;
  BYTE *cpy;
  BYTE *oend;
  BYTE *op;
  BYTE *iend;
  BYTE *ip;
  undefined8 local_108;
  BYTE *local_100;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  char *local_e0;
  char *local_d8;
  int local_cc;
  uint local_c8;
  uint local_c4;
  U32 s;
  U32 length_1;
  int local_b8;
  int local_b4;
  BYTE *local_b0;
  BYTE **local_a8;
  uint local_9c;
  uint local_98;
  uint local_94;
  U32 s_1;
  U32 length_2;
  undefined4 local_88;
  int local_84;
  BYTE *local_80;
  BYTE **local_78;
  uint local_6c;
  uint local_68;
  uint local_64;
  U32 s_2;
  U32 length_3;
  int local_58;
  int local_54;
  BYTE *local_50;
  BYTE **local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  U32 s_3;
  U32 length_4;
  undefined4 local_28;
  int local_24;
  BYTE *local_20;
  BYTE **local_18;
  uint local_c;
  
  local_100 = (BYTE *)(dest + -prefixSize);
  local_ec = 1;
  local_f0 = 0;
  local_f4 = 0;
  local_108 = 0;
  ip = (BYTE *)0x0;
  if (source == (char *)0x0) {
    return -1;
  }
  op = (BYTE *)(source + compressedSize);
  cpy = (BYTE *)(dest + maxOutputSize);
  _checkOffset = 0;
  shortiend._4_4_ = 1;
  shortiend._0_4_ = 1;
  shortoend = op + -0x10;
  match = cpy + -0x20;
  if (maxOutputSize == 0) {
    bVar6 = false;
    if (compressedSize == 1) {
      bVar6 = *source == '\0';
    }
    if (!bVar6) {
      return -1;
    }
    return 0;
  }
  if (compressedSize == 0) {
    return -1;
  }
  oend = (BYTE *)dest;
  iend = (BYTE *)source;
  local_e8 = maxOutputSize;
  local_e4 = compressedSize;
  local_e0 = dest;
  local_d8 = source;
  if (0x3f < (long)cpy - (long)dest) {
LAB_0015fe77:
    do {
      pBVar4 = iend + 1;
      length._4_4_ = (uint)*iend;
      _error_1 = (ulong)(*iend >> 4);
      if (_error_1 == 0xf) {
        copySize._4_4_ = 0;
        local_b0 = op + -0xf;
        local_a8 = &iend;
        local_b4 = local_ec;
        local_b8 = local_ec;
        _s = (undefined4 *)((long)&copySize + 4);
        local_c4 = 0;
        iend = pBVar4;
        if ((local_ec == 0) || (pBVar4 < local_b0)) {
          do {
            local_c8 = (uint)**local_a8;
            *local_a8 = *local_a8 + 1;
            local_c4 = local_c8 + local_c4;
            if ((local_b4 != 0) && (local_b0 <= *local_a8)) {
              *_s = 0xfffffffe;
              local_9c = local_c4;
              break;
            }
            local_9c = local_c4;
          } while (local_c8 == 0xff);
        }
        else {
          copySize._4_4_ = -1;
          local_9c = 0;
        }
        _error_1 = local_9c + _error_1;
        if (((copySize._4_4_ == -1) || ((shortiend._4_4_ != 0 && (oend + _error_1 < oend)))) ||
           ((shortiend._4_4_ != 0 && (iend + _error_1 < iend)))) goto LAB_001614ab;
        dictEnd = oend + _error_1;
        pBVar4 = iend;
        local_c4 = local_9c;
        if (local_ec == 0) {
          if (cpy + -8 < dictEnd) goto LAB_00160af5;
          LZ4_wildCopy8(oend,iend,dictEnd);
        }
        else {
          if (cpy + -0x20 < dictEnd) goto LAB_00160af5;
          if (op + -0x20 < iend + _error_1) goto LAB_00160af5;
          LZ4_wildCopy32(oend,iend,dictEnd);
        }
        iend = iend + _error_1;
      }
      else {
        dictEnd = oend + _error_1;
        if (local_ec == 0) {
          *(undefined8 *)oend = *(undefined8 *)pBVar4;
          if (8 < _error_1) {
            *(undefined8 *)(oend + 8) = *(undefined8 *)(iend + 9);
          }
        }
        else {
          if (op + -0x11 < pBVar4) goto LAB_00160af5;
          *(undefined8 *)oend = *(undefined8 *)pBVar4;
          *(undefined8 *)(oend + 8) = *(undefined8 *)(iend + 9);
        }
        iend = pBVar4 + _error_1;
      }
      oend = dictEnd;
      UVar2 = LZ4_readLE16(iend);
      uStack_168 = (ulong)UVar2;
      iend = iend + 2;
      offset = (size_t)(oend + -uStack_168);
      _error_1 = (ulong)(length._4_4_ & 0xf);
      if (_error_1 == 0xf) {
        copySize._0_4_ = 0;
        if (((int)shortiend != 0) && ((BYTE *)(offset + (long)ip) < local_100)) goto LAB_001614ab;
        local_80 = op + -4;
        local_78 = &iend;
        local_84 = local_ec;
        local_88 = 0;
        _s_1 = &copySize;
        local_94 = 0;
        do {
          local_98 = (uint)**local_78;
          *local_78 = *local_78 + 1;
          local_94 = local_98 + local_94;
          if ((local_84 != 0) && (local_80 <= *local_78)) {
            *(undefined4 *)_s_1 = 0xfffffffe;
            local_6c = local_94;
            break;
          }
          local_6c = local_94;
        } while (local_98 == 0xff);
        if (((int)copySize != 0) || ((shortiend._4_4_ != 0 && (oend + local_6c + _error_1 < oend))))
        goto LAB_001614ab;
        _error_1 = local_6c + _error_1 + 4;
        local_94 = local_6c;
        if (cpy + -0x40 <= oend + _error_1) goto LAB_00160e77;
      }
      else {
        _error_1 = _error_1 + 4;
        if (cpy + -0x40 <= oend + _error_1) goto LAB_00160e77;
        if (((local_f4 == 1) || (local_100 <= offset)) && (7 < uStack_168)) {
          *(undefined8 *)oend = *(undefined8 *)offset;
          *(undefined8 *)(oend + 8) = *(undefined8 *)(offset + 8);
          *(undefined2 *)(oend + 0x10) = *(undefined2 *)(offset + 0x10);
          oend = oend + _error_1;
          goto LAB_0015fe77;
        }
      }
      if (((int)shortiend != 0) && (ip + offset < local_100)) goto LAB_001614ab;
      if ((local_f4 == 2) && (offset < local_100)) {
        if (cpy + -5 < oend + _error_1) {
          if (local_f0 == 0) goto LAB_001614ab;
          if (_error_1 < (ulong)((long)cpy - (long)oend)) {
            local_220 = _error_1;
          }
          else {
            local_220 = (long)cpy - (long)oend;
          }
          _error_1 = local_220;
        }
        if ((long)local_100 - offset < _error_1) {
          restSize = (long)local_100 - offset;
          endOfMatch = (BYTE *)(_error_1 - restSize);
          memcpy(oend,(void *)(_checkOffset - restSize),restSize);
          oend = oend + restSize;
          if (oend + -(long)local_100 < endOfMatch) {
            copyFrom = oend + (long)endOfMatch;
            _error_3 = local_100;
            while (oend < copyFrom) {
              *oend = *_error_3;
              _error_3 = _error_3 + 1;
              oend = oend + 1;
            }
          }
          else {
            memcpy(oend,local_100,(size_t)endOfMatch);
            oend = endOfMatch + (long)oend;
          }
        }
        else {
          memmove(oend,(void *)(_checkOffset - ((long)local_100 - offset)),_error_1);
          oend = oend + _error_1;
        }
      }
      else {
        dictEnd = oend + _error_1;
        if (uStack_168 < 0x10) {
          LZ4_memcpy_using_offset(oend,(BYTE *)offset,dictEnd,uStack_168);
        }
        else {
          LZ4_wildCopy32(oend,(void *)offset,dictEnd);
        }
        oend = dictEnd;
      }
    } while( true );
  }
LAB_00160788:
  pBVar4 = iend + 1;
  length._4_4_ = (uint)*iend;
  _error_1 = (ulong)(*iend >> 4);
  iend = pBVar4;
  if (local_ec != 0) {
    if (_error_1 == 0xf) goto LAB_0016097e;
LAB_001607de:
    if (local_ec != 0 && shortoend <= pBVar4 || match < oend) goto LAB_0016097e;
    iVar3 = 8;
    if (local_ec != 0) {
      iVar3 = 0x10;
    }
    memcpy(oend,pBVar4,(long)iVar3);
    oend = oend + _error_1;
    iend = iend + _error_1;
    _error_1 = (ulong)(length._4_4_ & 0xf);
    UVar2 = LZ4_readLE16(iend);
    uStack_168 = (ulong)UVar2;
    iend = iend + 2;
    offset = (size_t)(oend + -uStack_168);
    if (((_error_1 != 0xf) && (7 < uStack_168)) && ((local_f4 == 1 || (local_100 <= offset)))) {
      *(undefined8 *)oend = *(undefined8 *)offset;
      *(undefined8 *)(oend + 8) = *(undefined8 *)(offset + 8);
      *(undefined2 *)(oend + 0x10) = *(undefined2 *)(offset + 0x10);
      oend = oend + _error_1 + 4;
      goto LAB_00160788;
    }
    goto LAB_00160d30;
  }
  if (_error_1 < 9) goto LAB_001607de;
LAB_0016097e:
  if (_error_1 == 0xf) {
    copySize_1._4_4_ = 0;
    local_50 = op + -0xf;
    local_48 = &iend;
    local_54 = local_ec;
    local_58 = local_ec;
    _s_2 = (undefined4 *)((long)&copySize_1 + 4);
    local_64 = 0;
    if ((local_ec == 0) || (pBVar4 < local_50)) {
      do {
        local_68 = (uint)**local_48;
        *local_48 = *local_48 + 1;
        local_64 = local_68 + local_64;
        if ((local_54 != 0) && (local_50 <= *local_48)) {
          *_s_2 = 0xfffffffe;
          local_3c = local_64;
          break;
        }
        local_3c = local_64;
      } while (local_68 == 0xff);
    }
    else {
      copySize_1._4_4_ = -1;
      local_3c = 0;
    }
    _error_1 = local_3c + _error_1;
    if (((copySize_1._4_4_ == -1) || ((shortiend._4_4_ != 0 && (oend + _error_1 < oend)))) ||
       ((local_64 = local_3c, shortiend._4_4_ != 0 && (iend + _error_1 < iend)))) goto LAB_001614ab;
  }
  dictEnd = oend + _error_1;
  pBVar4 = iend;
LAB_00160af5:
  iend = pBVar4;
  if (((local_ec != 0) && ((cpy + -0xc < dictEnd || (op + -8 < iend + _error_1)))) ||
     ((local_ec == 0 && (cpy + -8 < dictEnd)))) goto LAB_00160b5b;
  LZ4_wildCopy8(oend,iend,dictEnd);
  iend = iend + _error_1;
  oend = dictEnd;
LAB_00160cdc:
  UVar2 = LZ4_readLE16(iend);
  uStack_168 = (ulong)UVar2;
  iend = iend + 2;
  offset = (long)oend - uStack_168;
  _error_1 = (ulong)(length._4_4_ & 0xf);
LAB_00160d30:
  if (_error_1 == 0xf) {
    copySize_1._0_4_ = 0;
    local_20 = op + -4;
    local_18 = &iend;
    local_24 = local_ec;
    local_28 = 0;
    _s_3 = &copySize_1;
    local_34 = 0;
    do {
      local_38 = (uint)**local_18;
      *local_18 = *local_18 + 1;
      local_34 = local_38 + local_34;
      if ((local_24 != 0) && (local_20 <= *local_18)) {
        *(undefined4 *)_s_3 = 0xfffffffe;
        local_c = local_34;
        break;
      }
      local_c = local_34;
    } while (local_38 == 0xff);
    _error_1 = local_c + _error_1;
    if (((int)copySize_1 != 0) ||
       ((local_34 = local_c, shortiend._4_4_ != 0 && (oend + _error_1 < oend)))) goto LAB_001614ab;
  }
  _error_1 = _error_1 + 4;
LAB_00160e77:
  if (((int)shortiend != 0) && (ip + offset < local_100)) goto LAB_001614ab;
  if ((local_f4 == 2) && (offset < local_100)) {
    if (cpy + -5 < oend + _error_1) {
      if (local_f0 == 0) goto LAB_001614ab;
      if (_error_1 < (ulong)((long)cpy - (long)oend)) {
        local_230 = _error_1;
      }
      else {
        local_230 = (long)cpy - (long)oend;
      }
      _error_1 = local_230;
    }
    if ((long)local_100 - offset < _error_1) {
      __n = (long)local_100 - offset;
      __n_00 = _error_1 - __n;
      memcpy(oend,(void *)(_checkOffset - __n),__n);
      oend = oend + __n;
      if ((ulong)((long)oend - (long)local_100) < __n_00) {
        pBVar4 = oend + __n_00;
        mlen = (size_t)local_100;
        while (oend < pBVar4) {
          *oend = *(BYTE *)mlen;
          mlen = mlen + 1;
          oend = oend + 1;
        }
      }
      else {
        memcpy(oend,local_100,__n_00);
        oend = oend + __n_00;
      }
    }
    else {
      memmove(oend,(void *)(_checkOffset - ((long)local_100 - offset)),_error_1);
      oend = oend + _error_1;
    }
  }
  else {
    dictEnd = oend + _error_1;
    if ((local_f0 == 0) || (dictEnd <= cpy + -0xc)) {
      if (uStack_168 < 8) {
        LZ4_write32(oend,0);
        *oend = *(BYTE *)offset;
        oend[1] = *(BYTE *)(offset + 1);
        oend[2] = *(BYTE *)(offset + 2);
        oend[3] = *(BYTE *)(offset + 3);
        uVar1 = inc32table[uStack_168];
        *(undefined4 *)(oend + 4) = *(undefined4 *)(offset + uVar1);
        offset = (long)(offset + uVar1) - (long)dec64table[uStack_168];
      }
      else {
        *(undefined8 *)oend = *(undefined8 *)offset;
        offset = offset + 8;
      }
      pBVar4 = oend + 8;
      if (cpy + -0xc < dictEnd) {
        pBVar5 = cpy + -7;
        if (cpy + -5 < dictEnd) goto LAB_001614ab;
        oend = pBVar4;
        if (pBVar4 < pBVar5) {
          LZ4_wildCopy8(pBVar4,(void *)offset,pBVar5);
          offset = (size_t)(pBVar5 + (offset - (long)oend));
          oend = pBVar5;
        }
        while (oend < dictEnd) {
          *oend = *(BYTE *)offset;
          offset = offset + 1;
          oend = oend + 1;
        }
      }
      else {
        *(undefined8 *)pBVar4 = *(undefined8 *)offset;
        if (0x10 < _error_1) {
          pBVar5 = oend + 0x10;
          oend = pBVar4;
          LZ4_wildCopy8(pBVar5,(void *)(offset + 8),dictEnd);
        }
      }
      oend = dictEnd;
    }
    else {
      if (_error_1 < (ulong)((long)cpy - (long)oend)) {
        local_238 = _error_1;
      }
      else {
        local_238 = (long)cpy - (long)oend;
      }
      pBVar4 = oend + local_238;
      if (oend < (BYTE *)(offset + local_238)) {
        while (oend < pBVar4) {
          *oend = *(BYTE *)offset;
          offset = offset + 1;
          oend = oend + 1;
        }
      }
      else {
        memcpy(oend,(void *)offset,local_238);
      }
      oend = pBVar4;
      if (pBVar4 == cpy) {
LAB_00161470:
        if (local_ec == 0) {
          local_cc = (int)iend - (int)local_d8;
        }
        else {
          local_cc = (int)oend - (int)local_e0;
        }
        return local_cc;
      }
    }
  }
  goto LAB_00160788;
LAB_00160b5b:
  if (local_f0 == 0) {
    if (((local_ec == 0) && (dictEnd != cpy)) ||
       ((local_ec != 0 && ((iend + _error_1 != op || (cpy < dictEnd)))))) goto LAB_001614ab;
  }
  else {
    if ((op + -8 < iend + _error_1) && (iend + _error_1 != op)) {
LAB_001614ab:
      return -1 - ((int)iend - (int)local_d8);
    }
    if (cpy < dictEnd) {
      dictEnd = cpy;
      _error_1 = (long)cpy - (long)oend;
    }
  }
  memmove(oend,iend,_error_1);
  iend = iend + _error_1;
  oend = oend + _error_1;
  if (((local_f0 == 0) || (dictEnd == cpy)) || (iend == op)) goto LAB_00161470;
  goto LAB_00160cdc;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
static int LZ4_decompress_safe_withSmallPrefix(const char* source, char* dest, int compressedSize, int maxOutputSize,
                                               size_t prefixSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  endOnInputSize, decode_full_block, noDict,
                                  (BYTE*)dest-prefixSize, NULL, 0);
}